

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O1

void __thiscall QMimeData::setData(QMimeData *this,QString *mimeType,QByteArray *data)

{
  QMimeDataPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QLatin1StringView rhs;
  QStringView lhs;
  QByteArrayView in_stack_ffffffffffffffa0;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  if (((mimeType->d).size == 0xd) &&
     (rhs.m_data = "text/uri-list", rhs.m_size = 0xd, lhs.m_data = (mimeType->d).ptr,
     lhs.m_size = 0xd, bVar1 = QtPrivate::equalStrings(lhs,rhs), bVar1)) {
    dataToUrls(in_stack_ffffffffffffffa0);
    ::QVariant::QVariant(&local_48,(QList<QVariant> *)&stack0xffffffffffffffa0);
    QMimeDataPrivate::setData(this_00,mimeType,&local_48);
    ::QVariant::~QVariant(&local_48);
    QArrayDataPointer<QVariant>::~QArrayDataPointer
              ((QArrayDataPointer<QVariant> *)&stack0xffffffffffffffa0);
  }
  else {
    ::QVariant::QVariant(&local_48,data);
    QMimeDataPrivate::setData(this_00,mimeType,&local_48);
    ::QVariant::~QVariant(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeData::setData(const QString &mimeType, const QByteArray &data)
{
    Q_D(QMimeData);

    if (mimeType == "text/uri-list"_L1) {
        auto ba = QByteArrayView(data);
        if (ba.endsWith('\0'))
            ba.chop(1);
        d->setData(mimeType, dataToUrls(ba));
    } else {
        d->setData(mimeType, QVariant(data));
    }
}